

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_Font * ON_Font::GetManagedFontFromPostScriptName(wchar_t *postscript_name)

{
  wchar_t *postscript_name_00;
  ON_Font *this;
  ON_wString buffer;
  ON_Font font;
  
  ON_wString::ON_wString(&buffer,postscript_name);
  ON_wString::TrimLeftAndRight(&buffer,(wchar_t *)0x0);
  postscript_name_00 = ON_wString::operator_cast_to_wchar_t_(&buffer);
  this = &Default;
  if ((postscript_name_00 != (wchar_t *)0x0) && (*postscript_name_00 != L'\0')) {
    this = ON_FontList::Internal_FromNames
                     (&ON_ManagedFonts::List.m_managed_fonts,postscript_name_00,(wchar_t *)0x0,
                      (wchar_t *)0x0,(wchar_t *)0x0,Normal,Condensed,Upright,false,false,true,false,
                      false,0.0);
    if (this == (ON_Font *)0x0) {
      ON_ManagedFonts::InstalledFonts();
      this = ON_FontList::Internal_FromNames
                       (&ON_ManagedFonts::List.m_installed_fonts,postscript_name_00,(wchar_t *)0x0,
                        (wchar_t *)0x0,(wchar_t *)0x0,Normal,Condensed,Upright,false,false,true,
                        false,false,0.0);
      if (this == (ON_Font *)0x0) {
        ON_Font(&font,&Unset);
        Internal_SetFontWeightTrio(&font,Normal,-1,-1.23432101234321e+308,false);
        SetFontStretch(&font,Medium);
        this = &font;
        SetFontStyle(this,Upright);
        ON_wString::operator=(&font.m_loc_postscript_name,postscript_name_00);
        ON_wString::operator=(&font.m_en_postscript_name,&font.m_loc_postscript_name);
        if (font.m_runtime_serial_number == 0) {
          this = ON_ManagedFonts::GetFromFontCharacteristics(&ON_ManagedFonts::List,&font,true);
        }
        ~ON_Font(&font);
      }
      else if (this->m_runtime_serial_number == 0) {
        this = ON_ManagedFonts::GetFromFontCharacteristics(&ON_ManagedFonts::List,this,true);
      }
    }
  }
  ON_wString::~ON_wString(&buffer);
  return this;
}

Assistant:

const ON_Font* ON_Font::GetManagedFontFromPostScriptName(
  const wchar_t* postscript_name
  )
{
  ON_wString buffer(postscript_name);
  buffer.TrimLeftAndRight();
  postscript_name = buffer;
  if (nullptr == postscript_name || 0 == postscript_name[0])
    return &ON_Font::Default;

  const ON_Font* managed_font = ON_Font::ManagedFontList().FromPostScriptName(postscript_name);
  if (nullptr != managed_font)
    return managed_font;

  const ON_Font* installed_font = ON_Font::InstalledFontList().FromPostScriptName(postscript_name);
  if (nullptr != installed_font)
    return installed_font->ManagedFont();

  // This font is not installed.
  ON_Font font(ON_Font::Unset);

  // preferred weight/stretch/style since this font is not installed
  font.SetFontWeight(ON_Font::Weight::Normal);
  font.SetFontStretch(ON_Font::Stretch::Medium);
  font.SetFontStyle(ON_Font::Style::Upright);
  font.m_loc_postscript_name = postscript_name;
  font.m_en_postscript_name = font.m_loc_postscript_name;

  return font.ManagedFont();
}